

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockFailureTest.cpp
# Opt level: O0

void __thiscall
TEST_MockFailureTest_unexpectedCallHappened_Test::testBody
          (TEST_MockFailureTest_unexpectedCallHappened_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  undefined1 local_a8 [56];
  MockUnexpectedCallHappenedFailure failure;
  TEST_MockFailureTest_unexpectedCallHappened_Test *this_local;
  
  failure.super_MockFailure.super_TestFailure.message_.bufferSize_ = (size_t)this;
  pUVar1 = UtestShell::getCurrent();
  SimpleString::SimpleString((SimpleString *)(local_a8 + 0x20),"foobar");
  MockUnexpectedCallHappenedFailure::MockUnexpectedCallHappenedFailure
            ((MockUnexpectedCallHappenedFailure *)(local_a8 + 0x30),pUVar1,
             (SimpleString *)(local_a8 + 0x20),
             (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).list);
  SimpleString::~SimpleString((SimpleString *)(local_a8 + 0x20));
  pUVar1 = UtestShell::getCurrent();
  TestFailure::getMessage((TestFailure *)local_a8);
  pcVar2 = SimpleString::asCharString((SimpleString *)local_a8);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,
             "Mock Failure: Unexpected call to function: foobar\n\tEXPECTED calls that WERE NOT fulfilled:\n\t\t<none>\n\tEXPECTED calls that WERE fulfilled:\n\t\t<none>"
             ,pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockFailureTest.cpp"
             ,0x7b,pTVar3);
  SimpleString::~SimpleString((SimpleString *)local_a8);
  MockUnexpectedCallHappenedFailure::~MockUnexpectedCallHappenedFailure
            ((MockUnexpectedCallHappenedFailure *)(local_a8 + 0x30));
  return;
}

Assistant:

TEST(MockFailureTest, unexpectedCallHappened)
{
    MockUnexpectedCallHappenedFailure failure(UtestShell::getCurrent(), "foobar", *list);
    STRCMP_EQUAL("Mock Failure: Unexpected call to function: foobar\n"
                 "\tEXPECTED calls that WERE NOT fulfilled:\n"
                 "\t\t<none>\n"
                 "\tEXPECTED calls that WERE fulfilled:\n"
                 "\t\t<none>", failure.getMessage().asCharString());
}